

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr arg2;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    iVar2 = ctxt->valueNr;
    lVar3 = (long)iVar2;
    if (lVar3 < 1) {
      pxVar4 = (xmlXPathObjectPtr)0x0;
    }
    else {
      ctxt->valueNr = iVar2 + -1;
      if (iVar2 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ctxt->valueTab[lVar3 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ctxt->valueTab[lVar3 + -1];
      ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
    }
    iVar2 = ctxt->valueNr;
    lVar3 = (long)iVar2;
    if (lVar3 < 1) {
      pxVar5 = (xmlXPathObjectPtr)0x0;
    }
    else {
      ctxt->valueNr = iVar2 + -1;
      if (iVar2 == 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar5 = ctxt->valueTab[lVar3 + -2];
      }
      ctxt->value = pxVar5;
      pxVar5 = ctxt->valueTab[lVar3 + -1];
      ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
    }
    if ((pxVar5 == (xmlXPathObjectPtr)0x0) || (pxVar4 == (xmlXPathObjectPtr)0x0)) {
      if (pxVar5 != (xmlXPathObjectPtr)0x0) {
        pxVar4 = pxVar5;
      }
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      xmlXPathErr(ctxt,10);
    }
    else {
      if (pxVar5 != pxVar4) {
        if (((pxVar4->type | XPATH_USERS) != XPATH_XSLT_TREE) &&
           ((pxVar5->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
          iVar2 = xmlXPathEqualValuesCommon(ctxt,pxVar5,pxVar4);
          return (uint)(iVar2 == 0);
        }
        arg2 = pxVar5;
        if ((pxVar5->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          arg2 = pxVar4;
          pxVar4 = pxVar5;
        }
        uVar1 = 0;
        switch(arg2->type) {
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
          uVar1 = xmlXPathEqualNodeSets(ctxt,pxVar4,arg2,1);
          break;
        case XPATH_BOOLEAN:
          uVar1 = 0;
          if (pxVar4->nodesetval != (xmlNodeSetPtr)0x0) {
            uVar1 = (uint)(pxVar4->nodesetval->nodeNr != 0);
          }
          uVar1 = (uint)(uVar1 != arg2->boolval);
          break;
        case XPATH_NUMBER:
          uVar1 = xmlXPathEqualNodeSetFloat(ctxt,pxVar4,arg2->floatval,1);
          break;
        case XPATH_STRING:
          uVar1 = xmlXPathEqualNodeSetString(ctxt,pxVar4,arg2->stringval,1);
        }
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        xmlXPathReleaseObject(ctxt->context,arg2);
        return uVar1;
      }
      xmlXPathReleaseObject(ctxt->context,pxVar5);
    }
  }
  return 0;
}

Assistant:

int
xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg1, arg2, argtmp;
    int ret = 0;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if (arg1 == arg2) {
	xmlXPathReleaseObject(ctxt->context, arg1);
        return(0);
    }

    /*
     *If either argument is a nodeset, it's a 'special case'
     */
    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 *Hack it to assure arg1 is the nodeset
	 */
	if ((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE)) {
		argtmp = arg2;
		arg2 = arg1;
		arg1 = argtmp;
	}
	switch (arg2->type) {
	    case XPATH_UNDEFINED:
		break;
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		ret = xmlXPathEqualNodeSets(ctxt, arg1, arg2, 1);
		break;
	    case XPATH_BOOLEAN:
		if ((arg1->nodesetval == NULL) ||
		  (arg1->nodesetval->nodeNr == 0)) ret = 0;
		else
		    ret = 1;
		ret = (ret != arg2->boolval);
		break;
	    case XPATH_NUMBER:
		ret = xmlXPathEqualNodeSetFloat(ctxt, arg1, arg2->floatval, 1);
		break;
	    case XPATH_STRING:
		ret = xmlXPathEqualNodeSetString(ctxt, arg1,
                                                 arg2->stringval, 1);
		break;
	    case XPATH_USERS:
		/* TODO */
		break;
	}
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	return(ret);
    }

    return (!xmlXPathEqualValuesCommon(ctxt, arg1, arg2));
}